

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::parse_u16_array(CBS *cbs,Array<unsigned_short> *out)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  Array<unsigned_short> ret;
  CBS copy;
  Array<unsigned_short> local_48;
  CBS local_38;
  
  local_38.data = cbs->data;
  local_38.len = cbs->len;
  if ((local_38.len & 1) == 0) {
    local_48.data_ = (unsigned_short *)0x0;
    local_48.size_ = 0;
    bVar1 = Array<unsigned_short>::InitUninitialized(&local_48,local_38.len >> 1);
    if (bVar1) {
      if (local_48.size_ != 0) {
        lVar4 = 0;
        uVar3 = 0;
        do {
          iVar2 = CBS_get_u16(&local_38,(uint16_t *)((long)local_48.data_ + lVar4));
          if (iVar2 == 0) {
            bVar1 = false;
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                          ,0x9fa);
            goto LAB_0013bdda;
          }
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 2;
        } while (uVar3 < local_48.size_);
      }
      if (local_38.len != 0) {
        __assert_fail("CBS_len(&copy) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x9ff,"bool bssl::parse_u16_array(const CBS *, Array<uint16_t> *)");
      }
      OPENSSL_free(out->data_);
      out->data_ = (unsigned_short *)0x0;
      out->size_ = 0;
      out->data_ = local_48.data_;
      out->size_ = local_48.size_;
      local_48.data_ = (unsigned_short *)0x0;
      local_48.size_ = 0;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
LAB_0013bdda:
    OPENSSL_free(local_48.data_);
  }
  else {
    bVar1 = false;
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x9f0);
  }
  return bVar1;
}

Assistant:

static bool parse_u16_array(const CBS *cbs, Array<uint16_t> *out) {
  CBS copy = *cbs;
  if ((CBS_len(&copy) & 1) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  Array<uint16_t> ret;
  if (!ret.InitForOverwrite(CBS_len(&copy) / 2)) {
    return false;
  }
  for (size_t i = 0; i < ret.size(); i++) {
    if (!CBS_get_u16(&copy, &ret[i])) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  assert(CBS_len(&copy) == 0);
  *out = std::move(ret);
  return true;
}